

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * __thiscall tcu::Format::Bitfield<16UL>::toStream(Bitfield<16UL> *this,ostream *stream)

{
  char *__s;
  size_t sVar1;
  BitDesc *pBVar2;
  BitDesc *pBVar3;
  deUint64 dVar4;
  Hex<4UL> local_38;
  
  dVar4 = this->m_value;
  pBVar3 = this->m_begin;
  pBVar2 = this->m_end;
  if (pBVar3 != pBVar2) {
    do {
      if ((pBVar3->bit & dVar4) != 0) {
        if (dVar4 != this->m_value) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
        }
        __s = pBVar3->name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar1 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
        }
        dVar4 = dVar4 ^ pBVar3->bit;
        pBVar2 = this->m_end;
      }
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != pBVar2);
  }
  if (dVar4 != 0) {
    if (dVar4 != this->m_value) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"|",1);
    }
    local_38.value = dVar4;
    Hex<4UL>::toStream(&local_38,stream);
  }
  return stream;
}

Assistant:

std::ostream& toStream (std::ostream& stream)
	{
		deUint64 bitsLeft = m_value;
		for (const BitDesc* curDesc = m_begin; curDesc != m_end; curDesc++)
		{
			if (curDesc->bit & bitsLeft)
			{
				if (bitsLeft != m_value)
					stream << "|";
				stream << curDesc->name;
				bitsLeft ^= curDesc->bit;
			}
		}

		if (bitsLeft != 0)
		{
			if (bitsLeft != m_value)
				stream << "|";
			stream << Hex<BitfieldSize/4>(bitsLeft);
		}

		return stream;
	}